

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamHttp_p.cpp
# Opt level: O0

void __thiscall BamTools::Internal::BamHttp::ParseUrl(BamHttp *this,string *url)

{
  long lVar1;
  ulong uVar2;
  string *in_RSI;
  long in_RDI;
  string filename;
  size_t colonFound;
  string hostname;
  size_t firstSlashFound;
  size_t prefixFound;
  string tempUrl;
  string local_c0 [32];
  long local_a0;
  string *in_stack_ffffffffffffff68;
  string local_50 [32];
  string local_30 [48];
  
  *(undefined1 *)(in_RDI + 0xa8) = 0;
  std::__cxx11::string::string(local_30,in_RSI);
  toLower(in_stack_ffffffffffffff68);
  std::__cxx11::string::~string(local_50);
  lVar1 = std::__cxx11::string::find(local_30,0x2180f0);
  if (lVar1 != -1) {
    std::__cxx11::string::find((char)local_30,0x2f);
    std::__cxx11::string::substr((ulong)&stack0xffffffffffffff68,(ulong)local_30);
    local_a0 = std::__cxx11::string::find((char)&stack0xffffffffffffff68,0x3a);
    if (local_a0 == -1) {
      std::__cxx11::string::operator=((string *)(in_RDI + 0x38),(string *)&stack0xffffffffffffff68);
      std::__cxx11::string::operator=((string *)(in_RDI + 0x58),(string *)HTTP_PORT_abi_cxx11_);
    }
    std::__cxx11::string::substr((ulong)local_c0,(ulong)local_30);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::__cxx11::string::operator=((string *)(in_RDI + 0x78),local_c0);
      *(undefined1 *)(in_RDI + 0xa8) = 1;
    }
    std::__cxx11::string::~string(local_c0);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
  }
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void BamHttp::ParseUrl(const string& url) {

    // clear flag to start
    m_isUrlParsed = false;

    // make sure url starts with "http://", case-insensitive
    string tempUrl(url);
    toLower(tempUrl);
    const size_t prefixFound = tempUrl.find(HTTP_PREFIX);
    if ( prefixFound == string::npos )
        return;

    // find end of host name portion (first '/' hit after the prefix)
    const size_t firstSlashFound = tempUrl.find(HOST_SEPARATOR, HTTP_PREFIX_LENGTH);
    if ( firstSlashFound == string::npos ) {
        ;  // no slash found... no filename given along with host?
    }

    // fetch hostname (check for proxy port)
    string hostname = tempUrl.substr(HTTP_PREFIX_LENGTH, (firstSlashFound - HTTP_PREFIX_LENGTH));
    const size_t colonFound = hostname.find(PROXY_SEPARATOR);
    if ( colonFound != string::npos ) {
        ; // TODO: handle proxy port (later, just skip for now)
    } else {
        m_hostname = hostname;
        m_port = HTTP_PORT;
    }

    // store remainder of URL as filename (must be non-empty)
    string filename = tempUrl.substr(firstSlashFound);
    if ( filename.empty() )
        return;
    m_filename = filename;

    // set parsed OK flag
    m_isUrlParsed = true;
}